

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_invalid_loader_test.cpp
# Opt level: O2

void __thiscall
metacall_invalid_loader_test_DefaultConstructor_Test::
~metacall_invalid_loader_test_DefaultConstructor_Test
          (metacall_invalid_loader_test_DefaultConstructor_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(metacall_invalid_loader_test, DefaultConstructor)
{
	metacall_print_info();

	ASSERT_EQ((int)0, (int)metacall_initialize());

	static const char *invalid_scripts[] = {
		"a.invalid"
	};

	EXPECT_EQ((int)1, (int)metacall_load_from_file("invalid", invalid_scripts, sizeof(invalid_scripts) / sizeof(invalid_scripts[0]), NULL));

	static const char invalid_buffer[] = {
		"invalid"
	};

	EXPECT_EQ((int)1, (int)metacall_load_from_memory("invalid", invalid_buffer, sizeof(invalid_buffer), NULL));

	ASSERT_EQ((int)1, (int)metacall_is_initialized("invalid"));

	metacall_destroy();
}